

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O0

void __thiscall iu_Matcher_x_iutest_x_TypedEq_Test::Body(iu_Matcher_x_iutest_x_TypedEq_Test *this)

{
  bool bVar1;
  detail *pdVar2;
  int *expected;
  int **expected_00;
  int **v_00;
  AssertionResult *in_R8;
  undefined1 *local_4c0;
  string local_4b8;
  string local_498;
  AssertionHelper local_478;
  Fixed local_448;
  int *local_2c0;
  undefined1 *local_2b8;
  TypedEqMatcher<int_*> local_2b0;
  undefined1 local_298 [8];
  AssertionResult iutest_ar_1;
  string local_268;
  string local_248;
  AssertionHelper local_228;
  Fixed local_1f8;
  int local_60;
  undefined4 local_5c;
  TypedEqMatcher<int> local_58;
  undefined1 local_40 [8];
  AssertionResult iutest_ar;
  int v;
  iu_Matcher_x_iutest_x_TypedEq_Test *this_local;
  
  iutest_ar._36_4_ = 0;
  iutest::detail::AlwaysZero();
  local_5c = 1;
  iutest::matchers::TypedEq<int,int>(&local_58,(matchers *)&local_5c,expected);
  local_60 = 1;
  iutest::detail::TypedEqMatcher<int>::operator()((AssertionResult *)local_40,&local_58,&local_60);
  iutest::detail::TypedEqMatcher<int>::~TypedEqMatcher(&local_58);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    memset(&local_1f8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1f8);
    iutest_ar_1._36_4_ = 1;
    iutest::PrintToString<int>(&local_268,(int *)&iutest_ar_1.field_0x24);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_248,pdVar2,"TypedEq<int>(1)",local_40,in_R8);
    in_R8 = (AssertionResult *)0x1;
    iutest::AssertionHelper::AssertionHelper
              (&local_228,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x6a,&local_248,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_228,&local_1f8);
    iutest::AssertionHelper::~AssertionHelper(&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1f8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  iutest::detail::AlwaysZero();
  local_2b8 = &iutest_ar.field_0x24;
  iutest::matchers::TypedEq<int*,int*>(&local_2b0,(matchers *)&local_2b8,expected_00);
  local_2c0 = (int *)&iutest_ar.field_0x24;
  iutest::detail::TypedEqMatcher<int_*>::operator()
            ((AssertionResult *)local_298,&local_2b0,&local_2c0);
  iutest::detail::TypedEqMatcher<int_*>::~TypedEqMatcher(&local_2b0);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar1) {
    memset(&local_448,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_448);
    local_4c0 = &iutest_ar.field_0x24;
    iutest::PrintToString<int*>(&local_4b8,(iutest *)&local_4c0,v_00);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_498,pdVar2,"TypedEq<int*>(&v)",local_298,in_R8);
    iutest::AssertionHelper::AssertionHelper
              (&local_478,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x6b,&local_498,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_478,&local_448);
    iutest::AssertionHelper::~AssertionHelper(&local_478);
    std::__cxx11::string::~string((string *)&local_498);
    std::__cxx11::string::~string((string *)&local_4b8);
    iutest::AssertionHelper::Fixed::~Fixed(&local_448);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  return;
}

Assistant:

IUTEST(Matcher, TypedEq)
{
    int v=0;
    IUTEST_EXPECT_THAT(1, TypedEq<int>(1));
    IUTEST_EXPECT_THAT(&v, TypedEq<int*>(&v));
}